

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O3

int ProcessStandardArguments(ImportData *fill,char **params,uint num)

{
  byte *pbVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  char *pcVar6;
  long *local_50 [2];
  long local_40 [2];
  
  if (num != 0) {
    uVar5 = 0;
    do {
      pcVar6 = params[uVar5];
      printf("param = %s\n",pcVar6);
      iVar3 = strcmp(pcVar6,"-ptv");
      if ((iVar3 == 0) || (iVar3 = strcmp(pcVar6,"--pretransform-vertices"), iVar3 == 0)) {
        pbVar1 = (byte *)((long)&fill->ppFlags + 1);
        *pbVar1 = *pbVar1 | 1;
      }
      else {
        iVar3 = strcmp(pcVar6,"-gsn");
        if ((iVar3 == 0) || (iVar3 = strcmp(pcVar6,"--gen-smooth-normals"), iVar3 == 0)) {
          *(byte *)&fill->ppFlags = (byte)fill->ppFlags | 0x40;
        }
        else {
          iVar3 = strcmp(pcVar6,"-dn");
          if ((iVar3 == 0) || (iVar3 = strcmp(pcVar6,"--drop-normals"), iVar3 == 0)) {
            pbVar1 = (byte *)((long)&fill->ppFlags + 3);
            *pbVar1 = *pbVar1 | 0x40;
          }
          else {
            iVar3 = strcmp(pcVar6,"-gn");
            if ((iVar3 == 0) || (iVar3 = strcmp(pcVar6,"--gen-normals"), iVar3 == 0)) {
              *(byte *)&fill->ppFlags = (byte)fill->ppFlags | 0x20;
            }
            else {
              iVar3 = strcmp(pcVar6,"-jiv");
              if ((iVar3 == 0) || (iVar3 = strcmp(pcVar6,"--join-identical-vertices"), iVar3 == 0))
              {
                *(byte *)&fill->ppFlags = (byte)fill->ppFlags | 2;
              }
              else {
                iVar3 = strcmp(pcVar6,"-rrm");
                if ((iVar3 == 0) ||
                   (iVar3 = strcmp(pcVar6,"--remove-redundant-materials"), iVar3 == 0)) {
                  pbVar1 = (byte *)((long)&fill->ppFlags + 1);
                  *pbVar1 = *pbVar1 | 0x10;
                }
                else {
                  iVar3 = strcmp(pcVar6,"-fd");
                  if ((iVar3 == 0) || (iVar3 = strcmp(pcVar6,"--find-degenerates"), iVar3 == 0)) {
                    pbVar1 = (byte *)((long)&fill->ppFlags + 2);
                    *pbVar1 = *pbVar1 | 1;
                  }
                  else {
                    iVar3 = strcmp(pcVar6,"-slm");
                    if ((iVar3 == 0) || (iVar3 = strcmp(pcVar6,"--split-large-meshes"), iVar3 == 0))
                    {
                      *(byte *)&fill->ppFlags = (byte)fill->ppFlags | 0x80;
                    }
                    else {
                      iVar3 = strcmp(pcVar6,"-lbw");
                      if ((iVar3 == 0) ||
                         (iVar3 = strcmp(pcVar6,"--limit-bone-weights"), iVar3 == 0)) {
                        pbVar1 = (byte *)((long)&fill->ppFlags + 1);
                        *pbVar1 = *pbVar1 | 2;
                      }
                      else {
                        iVar3 = strcmp(pcVar6,"-vds");
                        if ((iVar3 == 0) ||
                           (iVar3 = strcmp(pcVar6,"--validate-data-structure"), iVar3 == 0)) {
                          pbVar1 = (byte *)((long)&fill->ppFlags + 1);
                          *pbVar1 = *pbVar1 | 4;
                        }
                        else {
                          iVar3 = strcmp(pcVar6,"-icl");
                          if ((iVar3 == 0) ||
                             (iVar3 = strcmp(pcVar6,"--improve-cache-locality"), iVar3 == 0)) {
                            pbVar1 = (byte *)((long)&fill->ppFlags + 1);
                            *pbVar1 = *pbVar1 | 8;
                          }
                          else {
                            iVar3 = strcmp(pcVar6,"-sbpt");
                            if ((iVar3 == 0) ||
                               (iVar3 = strcmp(pcVar6,"--sort-by-ptype"), iVar3 == 0)) {
                              pbVar1 = (byte *)((long)&fill->ppFlags + 1);
                              *pbVar1 = *pbVar1 | 0x80;
                            }
                            else {
                              iVar3 = strcmp(pcVar6,"-lh");
                              if ((iVar3 == 0) ||
                                 (iVar3 = strcmp(pcVar6,"--left-handed"), iVar3 == 0)) {
                                fill->ppFlags = fill->ppFlags | 0x1800004;
                              }
                              else {
                                iVar3 = strcmp(pcVar6,"-fuv");
                                if ((iVar3 == 0) || (iVar3 = strcmp(pcVar6,"--flip-uv"), iVar3 == 0)
                                   ) {
                                  pbVar1 = (byte *)((long)&fill->ppFlags + 2);
                                  *pbVar1 = *pbVar1 | 0x80;
                                }
                                else {
                                  iVar3 = strcmp(pcVar6,"-fwo");
                                  if ((iVar3 == 0) ||
                                     (iVar3 = strcmp(pcVar6,"--flip-winding-order"), iVar3 == 0)) {
                                    pbVar1 = (byte *)((long)&fill->ppFlags + 3);
                                    *pbVar1 = *pbVar1 | 1;
                                  }
                                  else {
                                    iVar3 = strcmp(pcVar6,"-tuv");
                                    if ((iVar3 == 0) ||
                                       (iVar3 = strcmp(pcVar6,"--transform-uv-coords"), iVar3 == 0))
                                    {
                                      pbVar1 = (byte *)((long)&fill->ppFlags + 2);
                                      *pbVar1 = *pbVar1 | 8;
                                    }
                                    else {
                                      iVar3 = strcmp(pcVar6,"-guv");
                                      if ((iVar3 == 0) ||
                                         (iVar3 = strcmp(pcVar6,"--gen-uvcoords"), iVar3 == 0)) {
                                        pbVar1 = (byte *)((long)&fill->ppFlags + 2);
                                        *pbVar1 = *pbVar1 | 4;
                                      }
                                      else {
                                        iVar3 = strcmp(pcVar6,"-fid");
                                        if ((iVar3 == 0) ||
                                           (iVar3 = strcmp(pcVar6,"--find-invalid-data"), iVar3 == 0
                                           )) {
                                          pbVar1 = (byte *)((long)&fill->ppFlags + 2);
                                          *pbVar1 = *pbVar1 | 2;
                                        }
                                        else {
                                          iVar3 = strcmp(pcVar6,"-fixn");
                                          if ((iVar3 == 0) ||
                                             (iVar3 = strcmp(pcVar6,"--fix-normals"), iVar3 == 0)) {
                                            pbVar1 = (byte *)((long)&fill->ppFlags + 1);
                                            *pbVar1 = *pbVar1 | 0x20;
                                          }
                                          else {
                                            iVar3 = strcmp(pcVar6,"-tri");
                                            if ((iVar3 == 0) ||
                                               (iVar3 = strcmp(pcVar6,"--triangulate"), iVar3 == 0))
                                            {
                                              *(byte *)&fill->ppFlags = (byte)fill->ppFlags | 8;
                                            }
                                            else {
                                              iVar3 = strcmp(pcVar6,"-cts");
                                              if ((iVar3 == 0) ||
                                                 (iVar3 = strcmp(pcVar6,"--calc-tangent-space"),
                                                 iVar3 == 0)) {
                                                *(byte *)&fill->ppFlags = (byte)fill->ppFlags | 1;
                                              }
                                              else {
                                                iVar3 = strcmp(pcVar6,"-fi");
                                                if ((iVar3 == 0) ||
                                                   (iVar3 = strcmp(pcVar6,"--find-instances"),
                                                   iVar3 == 0)) {
                                                  pbVar1 = (byte *)((long)&fill->ppFlags + 2);
                                                  *pbVar1 = *pbVar1 | 0x10;
                                                }
                                                else {
                                                  iVar3 = strcmp(pcVar6,"-og");
                                                  if ((iVar3 == 0) ||
                                                     (iVar3 = strcmp(pcVar6,"--optimize-graph"),
                                                     iVar3 == 0)) {
                                                    pbVar1 = (byte *)((long)&fill->ppFlags + 2);
                                                    *pbVar1 = *pbVar1 | 0x40;
                                                  }
                                                  else {
                                                    iVar3 = strcmp(pcVar6,"-om");
                                                    if ((iVar3 == 0) ||
                                                       (iVar3 = strcmp(pcVar6,"--optimize-meshes"),
                                                       iVar3 == 0)) {
                                                      pbVar1 = (byte *)((long)&fill->ppFlags + 2);
                                                      *pbVar1 = *pbVar1 | 0x20;
                                                    }
                                                    else {
                                                      iVar3 = strcmp(pcVar6,"-db");
                                                      if ((iVar3 == 0) ||
                                                         (iVar3 = strcmp(pcVar6,"--debone"),
                                                         iVar3 == 0)) {
                                                        pbVar1 = (byte *)((long)&fill->ppFlags + 3);
                                                        *pbVar1 = *pbVar1 | 4;
                                                      }
                                                      else {
                                                        iVar3 = strcmp(pcVar6,"-sbc");
                                                        if ((iVar3 == 0) ||
                                                           (iVar3 = strcmp(pcVar6,
                                                  "--split-by-bone-count"), iVar3 == 0)) {
                                                    pbVar1 = (byte *)((long)&fill->ppFlags + 3);
                                                    *pbVar1 = *pbVar1 | 2;
                                                  }
                                                  else {
                                                    iVar3 = strcmp(pcVar6,"-embtex");
                                                    if ((iVar3 == 0) ||
                                                       (iVar3 = strcmp(pcVar6,"--embed-textures"),
                                                       iVar3 == 0)) {
                                                      pbVar1 = (byte *)((long)&fill->ppFlags + 3);
                                                      *pbVar1 = *pbVar1 | 0x10;
                                                    }
                                                    else {
                                                      iVar3 = strcmp(pcVar6,"-gs");
                                                      if ((iVar3 == 0) ||
                                                         (iVar3 = strcmp(pcVar6,"--global-scale"),
                                                         iVar3 == 0)) {
                                                        pbVar1 = (byte *)((long)&fill->ppFlags + 3);
                                                        *pbVar1 = *pbVar1 | 8;
                                                      }
                                                      else {
                                                        cVar2 = *pcVar6;
                                                        if (cVar2 == '-') {
                                                          if ((pcVar6[1] == 'c') ||
                                                             (iVar3 = strncmp(pcVar6,"--config=",9),
                                                             iVar3 == 0)) {
LAB_002e3fb1:
                                                            if (params[uVar5][1] == '-') {
                                                              pcVar6 = pcVar6 + 9;
                                                            }
                                                            else {
                                                              pcVar6 = pcVar6 + 2;
                                                            }
                                                            iVar3 = strncmp(pcVar6,"full",4);
                                                            if (iVar3 == 0) {
                                                              fill->ppFlags =
                                                                   fill->ppFlags | 0x379ecb;
                                                            }
                                                            else {
                                                              iVar3 = strncmp(pcVar6,"default",7);
                                                              if (iVar3 == 0) {
                                                                fill->ppFlags =
                                                                     fill->ppFlags | 0x79acb;
                                                              }
                                                              else {
                                                                iVar3 = strncmp(pcVar6,"fast",4);
                                                                if (iVar3 == 0) {
                                                                  fill->ppFlags =
                                                                       fill->ppFlags | 0x4802b;
                                                                }
                                                              }
                                                            }
                                                          }
                                                          else if (((pcVar6[1] == 'l') &&
                                                                   (pcVar6[2] == '\0')) ||
                                                                  (iVar3 = strcmp(pcVar6,
                                                  "--show-log"), iVar3 == 0)) {
LAB_002e4027:
                                                    fill->showLog = true;
                                                  }
                                                  else {
                                                    if ((pcVar6[1] != 'v') || (pcVar6[2] != '\0'))
                                                    goto LAB_002e3f51;
LAB_002e403b:
                                                    fill->verbose = true;
                                                  }
                                                  }
                                                  else {
                                                    iVar3 = strncmp(pcVar6,"--config=",9);
                                                    if (iVar3 == 0) goto LAB_002e3fb1;
                                                    iVar3 = strcmp(pcVar6,"--show-log");
                                                    if (iVar3 == 0) goto LAB_002e4027;
LAB_002e3f51:
                                                    iVar3 = strcmp(pcVar6,"--verbose");
                                                    if (iVar3 == 0) goto LAB_002e403b;
                                                    iVar3 = strncmp(pcVar6,"--log-out=",10);
                                                    if ((iVar3 == 0) ||
                                                       (((cVar2 == '-' && (pcVar6[1] == 'l')) &&
                                                        (pcVar6[2] == 'o')))) {
                                                      pcVar6 = params[uVar5];
                                                      if (pcVar6[1] == '-') {
                                                        pcVar6 = pcVar6 + 10;
                                                      }
                                                      else {
                                                        pcVar6 = pcVar6 + 3;
                                                      }
                                                      local_50[0] = local_40;
                                                      sVar4 = strlen(pcVar6);
                                                      std::__cxx11::string::
                                                      _M_construct<char_const*>
                                                                ((string *)local_50,pcVar6,
                                                                 pcVar6 + sVar4);
                                                      std::__cxx11::string::operator=
                                                                ((string *)&fill->logFile,
                                                                 (string *)local_50);
                                                      if (local_50[0] != local_40) {
                                                        operator_delete(local_50[0],local_40[0] + 1)
                                                        ;
                                                      }
                                                      if ((fill->logFile)._M_string_length == 0) {
                                                        std::__cxx11::string::operator=
                                                                  ((string *)&fill->logFile,
                                                                   "assimp-log.txt");
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      uVar5 = uVar5 + 1;
    } while (num != uVar5);
  }
  if ((((fill->logFile)._M_string_length != 0) || (fill->showLog != false)) ||
     (fill->verbose == true)) {
    fill->log = true;
  }
  return 0;
}

Assistant:

int ProcessStandardArguments(
	ImportData& fill, 
	const char* const * params,
	unsigned int num)
{
	// -ptv    --pretransform-vertices
	// -gsn    --gen-smooth-normals
	// -gn     --gen-normals
	// -cts    --calc-tangent-space
	// -jiv    --join-identical-vertices
	// -rrm    --remove-redundant-materials
	// -fd     --find-degenerates
	// -slm    --split-large-meshes
	// -lbw    --limit-bone-weights
	// -vds    --validate-data-structure
	// -icl    --improve-cache-locality
	// -sbpt   --sort-by-ptype
	// -lh     --convert-to-lh
	// -fuv    --flip-uv
	// -fwo    --flip-winding-order
	// -tuv    --transform-uv-coords
	// -guv    --gen-uvcoords
	// -fid    --find-invalid-data
	// -fixn   --fix normals
	// -tri    --triangulate
	// -fi     --find-instances
	// -og     --optimize-graph
	// -om     --optimize-meshes
	// -db     --debone
	// -sbc    --split-by-bone-count
	// -gs	   --global-scale
	//
	// -c<file> --config-file=<file>

	for (unsigned int i = 0; i < num;++i) 
	{
        const char *param = params[ i ];
        printf( "param = %s\n", param );
		if (! strcmp( param, "-ptv") || ! strcmp( param, "--pretransform-vertices")) {
			fill.ppFlags |= aiProcess_PreTransformVertices;
		}
		else if (! strcmp( param, "-gsn") || ! strcmp( param, "--gen-smooth-normals")) {
			fill.ppFlags |= aiProcess_GenSmoothNormals;
		}
    else if (! strcmp( param, "-dn") || ! strcmp( param, "--drop-normals")) {
			fill.ppFlags |= aiProcess_DropNormals;
		}
		else if (! strcmp( param, "-gn") || ! strcmp( param, "--gen-normals")) {
			fill.ppFlags |= aiProcess_GenNormals;
		}
		else if (! strcmp( param, "-jiv") || ! strcmp( param, "--join-identical-vertices")) {
			fill.ppFlags |= aiProcess_JoinIdenticalVertices;
		}
		else if (! strcmp( param, "-rrm") || ! strcmp( param, "--remove-redundant-materials")) {
			fill.ppFlags |= aiProcess_RemoveRedundantMaterials;
		}
		else if (! strcmp( param, "-fd") || ! strcmp( param, "--find-degenerates")) {
			fill.ppFlags |= aiProcess_FindDegenerates;
		}
		else if (! strcmp( param, "-slm") || ! strcmp( param, "--split-large-meshes")) {
			fill.ppFlags |= aiProcess_SplitLargeMeshes;
		}
		else if (! strcmp( param, "-lbw") || ! strcmp( param, "--limit-bone-weights")) {
			fill.ppFlags |= aiProcess_LimitBoneWeights;
		}
		else if (! strcmp( param, "-vds") || ! strcmp( param, "--validate-data-structure")) {
			fill.ppFlags |= aiProcess_ValidateDataStructure;
		}
		else if (! strcmp( param, "-icl") || ! strcmp( param, "--improve-cache-locality")) {
			fill.ppFlags |= aiProcess_ImproveCacheLocality;
		}
		else if (! strcmp( param, "-sbpt") || ! strcmp( param, "--sort-by-ptype")) {
			fill.ppFlags |= aiProcess_SortByPType;
		}
		else if (! strcmp( param, "-lh") || ! strcmp( param, "--left-handed")) {
			fill.ppFlags |= aiProcess_ConvertToLeftHanded;
		}
		else if (! strcmp( param, "-fuv") || ! strcmp( param, "--flip-uv")) {
			fill.ppFlags |= aiProcess_FlipUVs;
		}
		else if (! strcmp( param, "-fwo") || ! strcmp( param, "--flip-winding-order")) {
			fill.ppFlags |= aiProcess_FlipWindingOrder;
		}
		else if (! strcmp( param, "-tuv") || ! strcmp( param, "--transform-uv-coords")) {
			fill.ppFlags |= aiProcess_TransformUVCoords;
		}
		else if (! strcmp( param, "-guv") || ! strcmp( param, "--gen-uvcoords")) {
			fill.ppFlags |= aiProcess_GenUVCoords;
		}
		else if (! strcmp( param, "-fid") || ! strcmp( param, "--find-invalid-data")) {
			fill.ppFlags |= aiProcess_FindInvalidData;
		}
		else if (! strcmp( param, "-fixn") || ! strcmp( param, "--fix-normals")) {
			fill.ppFlags |= aiProcess_FixInfacingNormals;
		}
		else if (! strcmp( param, "-tri") || ! strcmp( param, "--triangulate")) {
			fill.ppFlags |= aiProcess_Triangulate;
		}
		else if (! strcmp( param, "-cts") || ! strcmp( param, "--calc-tangent-space")) {
			fill.ppFlags |= aiProcess_CalcTangentSpace;
		}
		else if (! strcmp( param, "-fi") || ! strcmp( param, "--find-instances")) {
			fill.ppFlags |= aiProcess_FindInstances;
		}
		else if (! strcmp( param, "-og") || ! strcmp( param, "--optimize-graph")) {
			fill.ppFlags |= aiProcess_OptimizeGraph;
		}
		else if (! strcmp( param, "-om") || ! strcmp( param, "--optimize-meshes")) {
			fill.ppFlags |= aiProcess_OptimizeMeshes;
		}
		else if (! strcmp( param, "-db") || ! strcmp( param, "--debone")) {
			fill.ppFlags |= aiProcess_Debone;
		}
		else if (! strcmp( param, "-sbc") || ! strcmp( param, "--split-by-bone-count")) {
			fill.ppFlags |= aiProcess_SplitByBoneCount;
		}
		else if (!strcmp(param, "-embtex") || ! strcmp(param, "--embed-textures")) {
			fill.ppFlags |= aiProcess_EmbedTextures;
		}
		else if (!strcmp(param, "-gs") || ! strcmp(param, "--global-scale")) {
			fill.ppFlags |= aiProcess_GlobalScale;
		}
		else if (! strncmp( param, "-c",2) || ! strncmp( param, "--config=",9)) {
			const unsigned int ofs = (params[i][1] == '-' ? 9 : 2);

			// use default configurations
            if (!strncmp( param + ofs, "full", 4 )) {
                fill.ppFlags |= aiProcessPreset_TargetRealtime_MaxQuality;
            } else if (!strncmp( param + ofs, "default", 7 )) {
				fill.ppFlags |= aiProcessPreset_TargetRealtime_Quality;
			} else if (! strncmp( param +ofs,"fast",4)) {
				fill.ppFlags |= aiProcessPreset_TargetRealtime_Fast;
			}
		} else if (! strcmp( param, "-l") || ! strcmp( param, "--show-log")) {
			fill.showLog = true;
		}
		else if (! strcmp( param, "-v") || ! strcmp( param, "--verbose")) {
			fill.verbose = true;
		}
		else if (! strncmp( param, "--log-out=",10) || ! strncmp( param, "-lo",3)) {
			fill.logFile = std::string(params[i]+(params[i][1] == '-' ? 10 : 3));
			if (!fill.logFile.length()) {
				fill.logFile = "assimp-log.txt";
			}
		}
	}

	if (fill.logFile.length() || fill.showLog || fill.verbose) {
		fill.log = true;
	}

	return 0;
}